

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O3

bool __thiscall wasm::EffectAnalyzer::hasAnything(EffectAnalyzer *this)

{
  bool bVar1;
  undefined1 uVar2;
  
  uVar2 = 1;
  if (this->trap == false) {
    bVar1 = hasNonTrapSideEffects(this);
    if (((((!bVar1) &&
          ((this->localsRead)._M_t._M_impl.super__Rb_tree_header._M_node_count +
           (this->localsWritten)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) &&
         ((this->mutableGlobalsRead)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) &&
        ((this->readsMemory == false && (this->readsTable == false)))) &&
       ((this->readsMutableStruct == false &&
        ((this->readsArray == false && (this->isAtomic == false)))))) {
      uVar2 = this->calls;
    }
  }
  return (bool)uVar2;
}

Assistant:

bool hasAnything() const {
    return hasSideEffects() || accessesLocal() || readsMutableGlobalState();
  }